

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O3

QTransform * __thiscall
QGraphicsItemPrivate::TransformData::computedFullTransform
          (QTransform *__return_storage_ptr__,TransformData *this,QTransform *postmultiplyTransform)

{
  ushort uVar1;
  QGraphicsTransform *pQVar2;
  uint uVar3;
  long lVar4;
  TransformData *pTVar5;
  qreal *pqVar6;
  QTransform *pQVar7;
  int i;
  ulong uVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QTransform QStack_c8;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  bVar9 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->onlyTransform != true) {
    pTVar5 = this;
    pqVar6 = (qreal *)__return_storage_ptr__;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pqVar6 = (pTVar5->transform).m_matrix[0][0];
      pTVar5 = (TransformData *)((pTVar5->transform).m_matrix[0] + 1);
      pqVar6 = pqVar6 + 1;
    }
    if ((this->graphicsTransforms).d.size != 0) {
      local_74 = 0x3f800000;
      local_70 = 0;
      uStack_68 = 0;
      local_60 = 0x3f800000;
      local_5c = 0;
      uStack_54 = 0;
      local_4c = 0x3f800000;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0x3f800000;
      uVar8 = 0;
      do {
        pQVar2 = (this->graphicsTransforms).d.ptr[uVar8];
        (**(code **)(*(long *)pQVar2 + 0x60))(pQVar2,&local_74);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(this->graphicsTransforms).d.size);
      QMatrix4x4::toTransform();
      QTransform::operator*=(__return_storage_ptr__,&QStack_c8);
    }
    QTransform::translate(this->xOrigin,this->yOrigin);
    QTransform::rotate(this->rotation,(Axis)__return_storage_ptr__);
    QTransform::scale(this->scale,this->scale);
    QTransform::translate(-this->xOrigin,-this->yOrigin);
    if (postmultiplyTransform != (QTransform *)0x0) {
      QTransform::operator*=(__return_storage_ptr__,postmultiplyTransform);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
    goto LAB_005ebe6b;
  }
  pQVar7 = __return_storage_ptr__;
  if (postmultiplyTransform != (QTransform *)0x0) {
    if ((*(ushort *)&postmultiplyTransform->field_0x48 & 0x3e0) == 0) {
      uVar3 = *(ushort *)&postmultiplyTransform->field_0x48 & 0x1f;
    }
    else {
      uVar3 = QTransform::type();
    }
    if (uVar3 != 0) {
      uVar1 = *(ushort *)&(this->transform).field_0x48;
      if ((uVar1 & 0x3e0) == 0) {
        uVar3 = uVar1 & 0x1f;
      }
      else {
        uVar3 = QTransform::type();
      }
      if (uVar3 != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QTransform::operator*(__return_storage_ptr__,&this->transform);
          return __return_storage_ptr__;
        }
        goto LAB_005ebe6b;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_005ebe6b;
      lVar4 = 10;
      this = (TransformData *)postmultiplyTransform;
      goto LAB_005ebe0a;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_005ebe6b:
    __stack_chk_fail();
  }
  lVar4 = 10;
LAB_005ebe0a:
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    pQVar7->m_matrix[0][0] = (this->transform).m_matrix[0][0];
    this = (TransformData *)((long)this + (ulong)bVar9 * -0x10 + 8);
    pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform computedFullTransform(QTransform *postmultiplyTransform = nullptr) const
    {
        if (onlyTransform) {
            if (!postmultiplyTransform || postmultiplyTransform->isIdentity())
                return transform;
            if (transform.isIdentity())
                return *postmultiplyTransform;
            return transform * *postmultiplyTransform;
        }

        QTransform x(transform);
        if (!graphicsTransforms.isEmpty()) {
            QMatrix4x4 m;
            for (int i = 0; i < graphicsTransforms.size(); ++i)
                graphicsTransforms.at(i)->applyTo(&m);
            x *= m.toTransform();
        }
        x.translate(xOrigin, yOrigin);
        x.rotate(rotation);
        x.scale(scale, scale);
        x.translate(-xOrigin, -yOrigin);
        if (postmultiplyTransform)
            x *= *postmultiplyTransform;
        return x;
    }